

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void cf_event_set(cf_event_t *self)

{
  pthread_mutex_lock((pthread_mutex_t *)&self->mutex);
  self->event_status = 1;
  pthread_cond_broadcast((pthread_cond_t *)&self->cond);
  pthread_mutex_unlock((pthread_mutex_t *)&self->mutex);
  return;
}

Assistant:

void cf_event_set(cf_event_t* self) {
#if defined(CF_OS_WIN)
    SetEvent(self->handle);
#else
    pthread_mutex_lock(&self->mutex);
    self->event_status = CF_TRUE;
    pthread_cond_broadcast(&self->cond);
    pthread_mutex_unlock(&self->mutex);
#endif
}